

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cerr_log.cpp
# Opt level: O3

void __thiscall rookie::CErrorLog::logCStdError(CErrorLog *this)

{
  int *piVar1;
  char *rhs;
  
  LogStream::operator<<(&this->super_LogStream,"error number this ");
  piVar1 = __errno_location();
  LogStream::operator<<(&this->super_LogStream,*piVar1);
  LogStream::operator<<(&this->super_LogStream,"; error string is ");
  LogStream::operator<<(&this->super_LogStream,"\"");
  rhs = strerror(*piVar1);
  LogStream::operator<<(&this->super_LogStream,rhs);
  LogStream::operator<<(&this->super_LogStream,"\"");
  LogStream::operator<<(&this->super_LogStream,";");
  LogStream::operator<<(&this->super_LogStream,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CErrorLog::logCStdError(){
        this->operator<<( "error number this " );
        this->operator<<( errno );
        this->operator<<( "; error string is " );
        this->operator<<( "\"" );
        this->operator<<(std::strerror(errno));
        this->operator<<( "\"" );
        this->operator<<( ";" );
        this->operator<<( std::endl );
    }